

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# session_interface.cpp
# Opt level: O2

void __thiscall cppcms::session_interface::default_expiration(session_interface *this)

{
  allocator local_31;
  string local_30;
  
  check(this);
  std::__cxx11::string::string((string *)&local_30,"_h",&local_31);
  erase(this,&local_30);
  std::__cxx11::string::~string((string *)&local_30);
  this->how_ = this->how_def_;
  return;
}

Assistant:

void session_interface::default_expiration()
{
	check();
	erase("_h");
	how_=how_def_;
}